

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::VerifyUTF8(internal *this,StringPiece str,char *field_name)

{
  bool bVar1;
  char *local_40;
  undefined8 local_38;
  char local_30 [16];
  
  local_40 = local_30;
  if (this == (internal *)0x0) {
    local_38 = 0;
    local_30[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,this,str.ptr_ + (long)this);
  }
  bVar1 = IsStructurallyValidUTF8(local_40,(int)local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (!bVar1) {
    PrintUTF8ErrorLog((char *)str.length_,"parsing",false);
  }
  return bVar1;
}

Assistant:

bool VerifyUTF8(StringPiece str, const char* field_name) {
  if (!IsStructurallyValidUTF8(str)) {
    PrintUTF8ErrorLog(field_name, "parsing", false);
    return false;
  }
  return true;
}